

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
 pdqsort_detail::
 partition_right_branchless<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>>
           (FractionalInteger *param_1,FractionalInteger *param_2)

{
  bool bVar1;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  *p_Var2;
  uchar *offsets_l_00;
  unsigned_long *puVar3;
  reference this;
  undefined8 extraout_RDX;
  pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
  pVar4;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  pivot_pos;
  size_t num;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t right_split;
  size_t left_split;
  size_t num_unknown;
  size_t start_r;
  size_t start_l;
  size_t num_r;
  size_t num_l;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  offsets_r_base;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  offsets_l_base;
  uchar *offsets_r;
  uchar *offsets_l;
  uchar offsets_r_storage [128];
  uchar offsets_l_storage [128];
  bool already_partitioned;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  last;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  first;
  T pivot;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffcc8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffcd0;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  *in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffd5f;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  *in_stack_fffffffffffffd60;
  undefined6 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6e;
  undefined1 in_stack_fffffffffffffd6f;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  last_00;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd80;
  byte local_272;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_260;
  FractionalInteger *local_258;
  FractionalInteger *local_250;
  FractionalInteger *local_248;
  FractionalInteger *local_240;
  FractionalInteger *local_238;
  FractionalInteger *local_230;
  unsigned_long local_228;
  uchar *local_220;
  ulong local_218;
  FractionalInteger *local_210;
  ulong local_208;
  uchar *local_200;
  FractionalInteger *local_1f8;
  FractionalInteger *local_1f0;
  long local_1e8;
  long local_1e0;
  unsigned_long local_1d8;
  unsigned_long local_1d0;
  FractionalInteger *local_1c8;
  FractionalInteger *local_1c0;
  uchar *local_1b8;
  uchar *local_1b0;
  uchar local_1a8 [128];
  uchar local_128 [136];
  FractionalInteger *local_a0;
  FractionalInteger *local_98;
  undefined1 local_89;
  FractionalInteger *local_88;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_70;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_68 [9];
  FractionalInteger *local_20;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_18;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_10;
  undefined1 local_8;
  
  local_20 = param_2;
  local_18._M_current = param_1;
  __gnu_cxx::
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  ::operator*(&local_18);
  FractionalInteger::FractionalInteger
            (in_stack_fffffffffffffcd0._M_current,in_stack_fffffffffffffcc8._M_current);
  local_68[0]._M_current = local_18._M_current;
  local_70._M_current = local_20;
  do {
    p_Var2 = __gnu_cxx::
             __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
             ::operator++(local_68);
    __gnu_cxx::
    __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
    ::operator*(p_Var2);
    bVar1 = std::less<FractionalInteger>::operator()
                      ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                       in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ad0d1);
  } while (bVar1);
  local_88 = (FractionalInteger *)
             __gnu_cxx::
             __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
             ::operator-(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0._M_current);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      *)in_stack_fffffffffffffcd0._M_current,
                     (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      *)in_stack_fffffffffffffcc8._M_current);
  if (bVar1) {
    do {
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                          *)in_stack_fffffffffffffcd0._M_current,
                         (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                          *)in_stack_fffffffffffffcc8._M_current);
      local_272 = 0;
      if (bVar1) {
        p_Var2 = __gnu_cxx::
                 __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                 ::operator--(&local_70);
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator*(p_Var2);
        bVar1 = std::less<FractionalInteger>::operator()
                          ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                           in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ad19d);
        local_272 = bVar1 ^ 0xff;
      }
    } while ((local_272 & 1) != 0);
  }
  else {
    do {
      p_Var2 = __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator--(&local_70);
      __gnu_cxx::
      __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
      ::operator*(p_Var2);
      bVar1 = std::less<FractionalInteger>::operator()
                        ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                         in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ad1f6);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_89 = __gnu_cxx::operator>=
                       ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                         *)in_stack_fffffffffffffcd0._M_current,
                        (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                         *)in_stack_fffffffffffffcc8._M_current);
  if (!(bool)local_89) {
    local_98 = local_68[0]._M_current;
    local_a0 = local_70._M_current;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    __gnu_cxx::
    __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
    ::operator++(local_68);
    local_1b0 = align_cacheline<unsigned_char>(local_128);
    local_1b8 = align_cacheline<unsigned_char>(local_1a8);
    local_1c0 = local_68[0]._M_current;
    local_1c8 = local_70._M_current;
    local_1e8 = 0;
    local_1e0 = 0;
    local_1d8 = 0;
    local_1d0 = 0;
    while (bVar1 = __gnu_cxx::operator<
                             ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                               *)in_stack_fffffffffffffcd0._M_current,
                              (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                               *)in_stack_fffffffffffffcc8._M_current), bVar1) {
      local_1f0 = (FractionalInteger *)
                  __gnu_cxx::operator-
                            (in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current);
      if (local_1d0 == 0) {
        last_00._M_current = local_1f0;
        in_stack_fffffffffffffd80._M_current = local_1f0;
        if (local_1d8 == 0) {
          last_00._M_current = (FractionalInteger *)((ulong)local_1f0 >> 1);
          in_stack_fffffffffffffd80._M_current = (FractionalInteger *)((ulong)local_1f0 >> 1);
        }
      }
      else {
        last_00._M_current = (FractionalInteger *)0x0;
      }
      if (local_1d8 == 0) {
        offsets_l_00 = (uchar *)((long)local_1f0 - (long)last_00._M_current);
      }
      else {
        offsets_l_00 = (uchar *)0x0;
      }
      local_200 = offsets_l_00;
      local_1f8 = last_00._M_current;
      if (last_00._M_current < (FractionalInteger *)0x40) {
        local_210 = (FractionalInteger *)0x0;
        while (local_210 < local_1f8) {
          local_1b0[local_1d0] = (uchar)local_210;
          local_210 = (FractionalInteger *)((long)&local_210->fractionality + 1);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(local_68);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ad8d1);
          local_1d0 = ((bVar1 ^ 0xffU) & 1) + local_1d0;
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator++(local_68);
        }
      }
      else {
        local_208 = 0;
        while (local_208 < 0x40) {
          local_1b0[local_1d0] = (uchar)local_208;
          local_208 = local_208 + 1;
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(local_68);
          in_stack_fffffffffffffd6f =
               std::less<FractionalInteger>::operator()
                         ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                          in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ad459);
          local_1d0 = local_1d0 + ((byte)~in_stack_fffffffffffffd6f & 1);
          in_stack_fffffffffffffd60 = local_68;
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator++(in_stack_fffffffffffffd60);
          local_1b0[local_1d0] = (uchar)local_208;
          local_208 = local_208 + 1;
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(in_stack_fffffffffffffd60);
          in_stack_fffffffffffffd6e =
               std::less<FractionalInteger>::operator()
                         ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                          in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ad4eb);
          local_1d0 = local_1d0 + ((byte)~in_stack_fffffffffffffd6e & 1);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator++(local_68);
          local_1b0[local_1d0] = (uchar)local_208;
          local_208 = local_208 + 1;
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(local_68);
          in_stack_fffffffffffffd5f =
               std::less<FractionalInteger>::operator()
                         ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                          in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ad57d);
          local_1d0 = local_1d0 + ((byte)~in_stack_fffffffffffffd5f & 1);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator++(local_68);
          local_1b0[local_1d0] = (uchar)local_208;
          local_208 = local_208 + 1;
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(local_68);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ad609);
          local_1d0 = local_1d0 + ((byte)~bVar1 & 1);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator++(local_68);
          local_1b0[local_1d0] = (uchar)local_208;
          local_208 = local_208 + 1;
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(local_68);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ad695);
          local_1d0 = local_1d0 + ((byte)~bVar1 & 1);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator++(local_68);
          local_1b0[local_1d0] = (uchar)local_208;
          local_208 = local_208 + 1;
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(local_68);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ad71b);
          local_1d0 = local_1d0 + ((byte)~bVar1 & 1);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator++(local_68);
          local_1b0[local_1d0] = (uchar)local_208;
          local_208 = local_208 + 1;
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(local_68);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ad7a1);
          local_1d0 = local_1d0 + ((byte)~bVar1 & 1);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator++(local_68);
          local_1b0[local_1d0] = (uchar)local_208;
          local_208 = local_208 + 1;
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(local_68);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ad827);
          local_1d0 = ((bVar1 ^ 0xffU) & 1) + local_1d0;
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator++(local_68);
        }
      }
      if (local_200 < (uchar *)0x40) {
        local_220 = (uchar *)0x0;
        while (local_220 < local_200) {
          local_220 = local_220 + 1;
          local_1b8[local_1d8] = (uchar)local_220;
          p_Var2 = __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator--(&local_70);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(p_Var2);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6add77);
          local_1d8 = bVar1 + local_1d8;
        }
      }
      else {
        local_218 = 0;
        while (local_218 < 0x40) {
          local_218 = local_218 + 1;
          local_1b8[local_1d8] = (uchar)local_218;
          p_Var2 = __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator--(&local_70);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(p_Var2);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ad985);
          local_1d8 = local_1d8 + bVar1;
          local_218 = local_218 + 1;
          local_1b8[local_1d8] = (uchar)local_218;
          p_Var2 = __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator--(&local_70);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(p_Var2);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ad9ff);
          local_1d8 = local_1d8 + bVar1;
          local_218 = local_218 + 1;
          local_1b8[local_1d8] = (uchar)local_218;
          p_Var2 = __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator--(&local_70);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(p_Var2);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6ada79);
          local_1d8 = local_1d8 + bVar1;
          local_218 = local_218 + 1;
          local_1b8[local_1d8] = (uchar)local_218;
          p_Var2 = __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator--(&local_70);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(p_Var2);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6adaf3);
          local_1d8 = local_1d8 + bVar1;
          local_218 = local_218 + 1;
          local_1b8[local_1d8] = (uchar)local_218;
          p_Var2 = __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator--(&local_70);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(p_Var2);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6adb6d);
          local_1d8 = local_1d8 + bVar1;
          local_218 = local_218 + 1;
          local_1b8[local_1d8] = (uchar)local_218;
          p_Var2 = __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator--(&local_70);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(p_Var2);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6adbe7);
          local_1d8 = local_1d8 + bVar1;
          local_218 = local_218 + 1;
          local_1b8[local_1d8] = (uchar)local_218;
          p_Var2 = __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator--(&local_70);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(p_Var2);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6adc61);
          local_1d8 = local_1d8 + bVar1;
          local_218 = local_218 + 1;
          local_1b8[local_1d8] = (uchar)local_218;
          p_Var2 = __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator--(&local_70);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(p_Var2);
          bVar1 = std::less<FractionalInteger>::operator()
                            ((less<FractionalInteger> *)in_stack_fffffffffffffcd0._M_current,
                             in_stack_fffffffffffffcc8._M_current,(FractionalInteger *)0x6adcdb);
          local_1d8 = bVar1 + local_1d8;
        }
      }
      puVar3 = std::min<unsigned_long>(&local_1d0,&local_1d8);
      local_228 = *puVar3;
      local_230 = local_1c0;
      local_238 = local_1c8;
      swap_offsets<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                (in_stack_fffffffffffffd80,last_00,offsets_l_00,
                 (uchar *)CONCAT17(in_stack_fffffffffffffd6f,
                                   CONCAT16(in_stack_fffffffffffffd6e,in_stack_fffffffffffffd68)),
                 (size_t)in_stack_fffffffffffffd60,(bool)in_stack_fffffffffffffd5f);
      local_1d0 = local_1d0 - local_228;
      local_1d8 = local_1d8 - local_228;
      local_1e0 = local_228 + local_1e0;
      local_1e8 = local_228 + local_1e8;
      if (local_1d0 == 0) {
        local_1e0 = 0;
        local_1c0 = local_68[0]._M_current;
      }
      if (local_1d8 == 0) {
        local_1e8 = 0;
        local_1c8 = local_70._M_current;
      }
    }
    if (local_1d0 != 0) {
      local_1b0 = local_1b0 + local_1e0;
      while (local_1d0 != 0) {
        local_1d0 = local_1d0 - 1;
        local_240 = (FractionalInteger *)
                    __gnu_cxx::
                    __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                    ::operator+(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0._M_current);
        p_Var2 = __gnu_cxx::
                 __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                 ::operator--(&local_70);
        local_248 = p_Var2->_M_current;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                  (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      }
      local_68[0]._M_current = local_70._M_current;
      local_1d0 = local_1d0 - 1;
    }
    if (local_1d8 != 0) {
      local_1b8 = local_1b8 + local_1e8;
      while (local_1d8 != 0) {
        local_1d8 = local_1d8 - 1;
        local_250 = (FractionalInteger *)
                    __gnu_cxx::
                    __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                    ::operator-(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0._M_current);
        local_258 = local_68[0]._M_current;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                  (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator++(local_68);
      }
      local_70._M_current = local_68[0]._M_current;
      local_1d8 = local_1d8 - 1;
    }
  }
  local_260 = __gnu_cxx::
              __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
              ::operator-(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0._M_current);
  p_Var2 = &local_260;
  this = __gnu_cxx::
         __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
         ::operator*(p_Var2);
  __gnu_cxx::
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  ::operator*(&local_18);
  FractionalInteger::operator=(this,in_stack_fffffffffffffcc8._M_current);
  __gnu_cxx::
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  ::operator*(p_Var2);
  FractionalInteger::operator=(this,in_stack_fffffffffffffcc8._M_current);
  pVar4 = std::
          make_pair<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>&,bool&>
                    ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      *)this,(bool *)in_stack_fffffffffffffcc8._M_current);
  local_10 = pVar4.first._M_current;
  local_8 = pVar4.second;
  FractionalInteger::~FractionalInteger((FractionalInteger *)0x6ae116);
  pVar4._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  pVar4.second = (bool)local_8;
  pVar4.first._M_current = local_10._M_current;
  return pVar4;
}

Assistant:

inline std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;

        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));
        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        if (!already_partitioned) {
            std::iter_swap(first, last);
            ++first;

            // The following branchless partitioning is derived from "BlockQuicksort: How Branch
            // Mispredictions don’t affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
            // heavily micro-optimized.
            unsigned char offsets_l_storage[block_size + cacheline_size];
            unsigned char offsets_r_storage[block_size + cacheline_size];
            unsigned char* offsets_l = align_cacheline(offsets_l_storage);
            unsigned char* offsets_r = align_cacheline(offsets_r_storage);

            Iter offsets_l_base = first;
            Iter offsets_r_base = last;
            size_t num_l, num_r, start_l, start_r;
            num_l = num_r = start_l = start_r = 0;
            
            while (first < last) {
                // Fill up offset blocks with elements that are on the wrong side.
                // First we determine how much elements are considered for each offset block.
                size_t num_unknown = last - first;
                size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
                size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

                // Fill the offset blocks.
                if (left_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                } else {
                    for (size_t i = 0; i < left_split;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                }

                if (right_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                } else {
                    for (size_t i = 0; i < right_split;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                }

                // Swap elements and update block sizes and first/last boundaries.
                size_t num = std::min(num_l, num_r);
                swap_offsets(offsets_l_base, offsets_r_base,
                             offsets_l + start_l, offsets_r + start_r,
                             num, num_l == num_r);
                num_l -= num; num_r -= num;
                start_l += num; start_r += num;

                if (num_l == 0) {
                    start_l = 0;
                    offsets_l_base = first;
                }
                
                if (num_r == 0) {
                    start_r = 0;
                    offsets_r_base = last;
                }
            }

            // We have now fully identified [first, last)'s proper position. Swap the last elements.
            if (num_l) {
                offsets_l += start_l;
                while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
                first = last;
            }
            if (num_r) {
                offsets_r += start_r;
                while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
                last = first;
            }
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }